

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCStream(ZSTD_CStream *zcs,int compressionLevel)

{
  size_t sVar1;
  int iVar2;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  sVar1 = ZSTD_CCtx_refCDict(zcs,(ZSTD_CDict *)0x0);
  if (sVar1 < 0xffffffffffffff89) {
    if (zcs->streamStage != zcss_init) {
      zcs->cParamsChanged = 1;
    }
    iVar2 = -0x20000;
    if (((-0x20001 < compressionLevel) && (iVar2 = 0x16, compressionLevel < 0x17)) &&
       (iVar2 = 3, compressionLevel != 0)) {
      iVar2 = compressionLevel;
    }
    (zcs->requestedParams).compressionLevel = iVar2;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initCStream(ZSTD_CStream* zcs, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    return 0;
}